

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q3b_kheap_height.cpp
# Opt level: O0

int main(void)

{
  istream *this;
  ostream *poVar1;
  ulong uVar2;
  __type _Var3;
  double dVar4;
  undefined1 auVar5 [16];
  unsigned_long local_30;
  uint64_t f;
  uint64_t s;
  uint64_t k;
  uint64_t n;
  
  n._4_4_ = 0;
  this = (istream *)std::istream::operator>>((istream *)&std::cin,&k);
  std::istream::operator>>(this,&s);
  if (s == 1) {
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,k - 1);
    std::operator<<(poVar1,"\n");
  }
  else {
    local_30 = 0;
    f = 0;
    while (f < k) {
      _Var3 = std::pow<unsigned_long,unsigned_long>(s,local_30);
      auVar5._8_4_ = (int)(f >> 0x20);
      auVar5._0_8_ = f;
      auVar5._12_4_ = 0x45300000;
      dVar4 = (auVar5._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)f) - 4503599627370496.0) + _Var3;
      uVar2 = (ulong)dVar4;
      local_30 = local_30 + 1;
      f = uVar2 | (long)(dVar4 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f;
    }
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_30 - 1);
    std::operator<<(poVar1,"\n");
  }
  return n._4_4_;
}

Assistant:

int main() {
    uint64_t n, k, s, f;
    cin >> n >> k;
    if (k == 1)
        cout << n - k << "\n";
    else {
        s = 0;
        f = 0;
        while (s < n) {
            s += pow(k, f++);
        }
        cout << f - 1 << "\n";
    }
}